

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void kj::(anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
               (EncodingResult<kj::Array<char16_t>_> *result,char16_t (*expected) [3],bool errors)

{
  char16_t *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  undefined7 in_register_00000011;
  char16_t *ptrCopy;
  bool in_R8B;
  ArrayPtr<const_char16_t> expected_00;
  char16_t *local_38;
  size_t local_30;
  ArrayDisposer *local_28;
  undefined1 local_20;
  
  expected_00.size_ = CONCAT71(in_register_00000011,errors) & 0xffffffff;
  pcVar1 = (result->super_Array<char16_t>).ptr;
  sVar2 = (result->super_Array<char16_t>).size_;
  pAVar3 = (result->super_Array<char16_t>).disposer;
  (result->super_Array<char16_t>).ptr = (char16_t *)0x0;
  (result->super_Array<char16_t>).size_ = 0;
  local_20 = result->hadErrors;
  expected_00.ptr = (char16_t *)0x2;
  local_38 = pcVar1;
  local_30 = sVar2;
  local_28 = pAVar3;
  expectResImpl<kj::Array<char16_t>,char16_t>
            ((_anonymous_namespace_ *)&local_38,(EncodingResult<kj::Array<char16_t>_> *)expected,
             expected_00,in_R8B);
  if (pcVar1 != (char16_t *)0x0) {
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,2,sVar2,sVar2,0);
  }
  return;
}

Assistant:

void expectRes(EncodingResult<T> result,
               const U (&expected)[s],
               bool errors = false) {
  expectResImpl(kj::mv(result), arrayPtr(expected, s - 1), errors);
}